

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState
          (ConsumerEndpointImpl *this,QueryServiceStateCallback *callback)

{
  TracingServiceImpl *pTVar1;
  _Base_ptr p_Var2;
  char *__s;
  _Rb_tree_node_base *p_Var3;
  TracingServiceState_Producer *this_00;
  _Base_ptr p_Var4;
  TracingServiceState_DataSource *this_01;
  DataSourceDescriptor *this_02;
  TracingServiceState_TracingSession *this_03;
  int value;
  pair<unsigned_int,_unsigned_long> *snap_kv;
  _Base_ptr p_Var5;
  allocator<char> local_109;
  ConsumerEndpointImpl *local_108;
  string local_100;
  QueryServiceStateCallback *local_e0;
  TracingServiceState svc_state;
  
  protos::gen::TracingServiceState::TracingServiceState(&svc_state);
  pTVar1 = this->service_;
  local_108 = this;
  __s = base::GetVersionString();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,__s,&local_109);
  protos::gen::TracingServiceState::set_tracing_service_version(&svc_state,&local_100);
  ::std::__cxx11::string::~string((string *)&local_100);
  protos::gen::TracingServiceState::set_num_sessions
            (&svc_state,
             (int32_t)(pTVar1->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  value = 0;
  for (p_Var3 = (pTVar1->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(pTVar1->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3)) {
    value = value + (uint)(*(int *)&p_Var3[0x18]._M_parent == 2);
  }
  local_e0 = callback;
  protos::gen::TracingServiceState::set_num_sessions_started(&svc_state,value);
  pTVar1 = local_108->service_;
  for (p_Var4 = (pTVar1->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pTVar1->producers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
    this_00 = protos::gen::TracingServiceState::add_producers(&svc_state);
    protos::gen::TracingServiceState_Producer::set_id
              (this_00,(uint)(ushort)(short)p_Var4[1]._M_color);
    protos::gen::TracingServiceState_Producer::set_name
              (this_00,(string *)&p_Var4[1]._M_parent[4]._M_parent);
    protos::gen::TracingServiceState_Producer::set_sdk_version
              (this_00,(string *)&p_Var4[1]._M_parent[5]._M_parent);
    protos::gen::TracingServiceState_Producer::set_uid
              (this_00,*(int32_t *)((long)&(p_Var4[1]._M_parent)->_M_parent + 4));
    protos::gen::TracingServiceState_Producer::set_pid
              (this_00,*(int32_t *)&(p_Var4[1]._M_parent)->_M_left);
  }
  pTVar1 = local_108->service_;
  for (p_Var4 = (pTVar1->data_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pTVar1->data_sources_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
    this_01 = protos::gen::TracingServiceState::add_data_sources(&svc_state);
    this_02 = protos::gen::TracingServiceState_DataSource::mutable_ds_descriptor(this_01);
    protos::gen::DataSourceDescriptor::operator=
              (this_02,(DataSourceDescriptor *)&p_Var4[2]._M_parent);
    protos::gen::TracingServiceState_DataSource::set_producer_id
              (this_01,(uint)(ushort)(short)p_Var4[2]._M_color);
  }
  protos::gen::TracingServiceState::set_supports_tracing_sessions(&svc_state,true);
  pTVar1 = local_108->service_;
  p_Var4 = (pTVar1->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(pTVar1->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header
       ) {
      std::function<void_(bool,_const_perfetto::protos::gen::TracingServiceState_&)>::operator()
                (local_e0,true,&svc_state);
      protos::gen::TracingServiceState::~TracingServiceState(&svc_state);
      return;
    }
    if ((local_108->uid_ == 0) || (local_108->uid_ == *(uid_t *)&p_Var4[1]._M_right)) {
      this_03 = protos::gen::TracingServiceState::add_tracing_sessions(&svc_state);
      protos::gen::TracingServiceState_TracingSession::set_id(this_03,(uint64_t)p_Var4[1]._M_parent)
      ;
      protos::gen::TracingServiceState_TracingSession::set_consumer_uid
                (this_03,*(int32_t *)&p_Var4[1]._M_right);
      protos::gen::TracingServiceState_TracingSession::set_duration_ms
                (this_03,*(uint32_t *)&p_Var4[4]._M_right);
      protos::gen::TracingServiceState_TracingSession::set_num_data_sources
                (this_03,p_Var4[0x10]._M_color);
      protos::gen::TracingServiceState_TracingSession::set_unique_session_name
                (this_03,(string *)&p_Var4[10]._M_left);
      p_Var2 = p_Var4[0x16]._M_right;
      for (p_Var5 = p_Var4[0x16]._M_left; p_Var5 != p_Var2; p_Var5 = (_Base_ptr)&p_Var5->_M_left) {
        if (p_Var5->_M_color == _S_black) {
          protos::gen::TracingServiceState_TracingSession::set_start_realtime_ns
                    (this_03,(int64_t)p_Var5->_M_parent);
        }
      }
      p_Var2 = p_Var4[3]._M_parent;
      for (p_Var5 = *(_Base_ptr *)(p_Var4 + 3); p_Var5 != p_Var2;
          p_Var5 = (_Base_ptr)&p_Var5[1]._M_right) {
        protos::gen::TracingServiceState_TracingSession::add_buffer_size_kb
                  (this_03,*(uint32_t *)&p_Var5->_M_parent);
      }
      switch(*(undefined4 *)&p_Var4[0x18]._M_parent) {
      case 0:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"DISABLED",&local_109);
        protos::gen::TracingServiceState_TracingSession::set_state(this_03,&local_100);
        break;
      case 1:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"CONFIGURED",&local_109);
        protos::gen::TracingServiceState_TracingSession::set_state(this_03,&local_100);
        break;
      case 2:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"STARTED",&local_109);
        protos::gen::TracingServiceState_TracingSession::set_state(this_03,&local_100);
        break;
      case 3:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"STOP_WAIT",&local_109);
        protos::gen::TracingServiceState_TracingSession::set_state(this_03,&local_100);
        break;
      default:
        goto switchD_002ff736_default;
      }
      ::std::__cxx11::string::~string((string *)&local_100);
    }
switchD_002ff736_default:
    p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryServiceState(
    QueryServiceStateCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceState svc_state;

  const auto& sessions = service_->tracing_sessions_;
  svc_state.set_tracing_service_version(base::GetVersionString());
  svc_state.set_num_sessions(static_cast<int>(sessions.size()));

  int num_started = 0;
  for (const auto& kv : sessions)
    num_started += kv.second.state == TracingSession::State::STARTED ? 1 : 0;
  svc_state.set_num_sessions_started(static_cast<int>(num_started));

  for (const auto& kv : service_->producers_) {
    auto* producer = svc_state.add_producers();
    producer->set_id(static_cast<int>(kv.first));
    producer->set_name(kv.second->name_);
    producer->set_sdk_version(kv.second->sdk_version_);
    producer->set_uid(static_cast<int32_t>(kv.second->uid()));
    producer->set_pid(static_cast<int32_t>(kv.second->pid()));
  }

  for (const auto& kv : service_->data_sources_) {
    const auto& registered_data_source = kv.second;
    auto* data_source = svc_state.add_data_sources();
    *data_source->mutable_ds_descriptor() = registered_data_source.descriptor;
    data_source->set_producer_id(
        static_cast<int>(registered_data_source.producer_id));
  }

  svc_state.set_supports_tracing_sessions(true);
  for (const auto& kv : service_->tracing_sessions_) {
    const TracingSession& s = kv.second;
    // List only tracing sessions for the calling UID (or everything for root).
    if (uid_ != 0 && uid_ != s.consumer_uid)
      continue;
    auto* session = svc_state.add_tracing_sessions();
    session->set_id(s.id);
    session->set_consumer_uid(static_cast<int>(s.consumer_uid));
    session->set_duration_ms(s.config.duration_ms());
    session->set_num_data_sources(
        static_cast<uint32_t>(s.data_source_instances.size()));
    session->set_unique_session_name(s.config.unique_session_name());
    for (const auto& snap_kv : s.initial_clock_snapshot) {
      if (snap_kv.first == protos::pbzero::BUILTIN_CLOCK_REALTIME)
        session->set_start_realtime_ns(static_cast<int64_t>(snap_kv.second));
    }
    for (const auto& buf : s.config.buffers())
      session->add_buffer_size_kb(buf.size_kb());

    switch (s.state) {
      case TracingSession::State::DISABLED:
        session->set_state("DISABLED");
        break;
      case TracingSession::State::CONFIGURED:
        session->set_state("CONFIGURED");
        break;
      case TracingSession::State::STARTED:
        session->set_state("STARTED");
        break;
      case TracingSession::State::DISABLING_WAITING_STOP_ACKS:
        session->set_state("STOP_WAIT");
        break;
    }
  }
  callback(/*success=*/true, svc_state);
}